

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_get_prop_list
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  
  if (getp_get_prop_list(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc ==
      '\0') {
    iVar3 = __cxa_guard_acquire(&getp_get_prop_list(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                 ::desc);
    if (iVar3 != 0) {
      getp_get_prop_list::desc.min_argc_ = 0;
      getp_get_prop_list::desc.opt_argc_ = 0;
      getp_get_prop_list::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_prop_list(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                           ::desc);
    }
  }
  iVar3 = get_prop_check_argc(retval,argc,&getp_get_prop_list::desc);
  pvVar2 = sp_;
  if (iVar3 == 0) {
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    (*this->_vptr_CVmObject[0x10])(this,self,retval);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObject::getp_get_prop_list(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc,
                                  vm_prop_id_t, vm_obj_id_t *)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* build my property list */
    build_prop_list(vmg_ self, retval);

    /* discard the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}